

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepImageIO.cpp
# Opt level: O2

void Imf_3_2::anon_unknown_24::loadLevel(DeepTiledInputFile *in,DeepImage *img,int x,int y)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  iterator iVar3;
  Iterator IVar4;
  int iVar5;
  Edit edit;
  DeepFrameBuffer fb;
  undefined1 local_d0 [56];
  DeepFrameBuffer local_98;
  DeepImageLevel *this;
  
  iVar1 = (*(img->super_Image)._vptr_Image[5])(img,(ulong)(uint)x,(ulong)(uint)y);
  this = (DeepImageLevel *)CONCAT44(extraout_var,iVar1);
  DeepFrameBuffer::DeepFrameBuffer((DeepFrameBuffer *)(local_d0 + 0x38));
  SampleCountChannel::slice((SampleCountChannel *)local_d0);
  Imf_3_2::DeepFrameBuffer::insertSampleCountSlice((Slice *)(local_d0 + 0x38));
  iVar3._M_node = (_Base_ptr)DeepImageLevel::begin(this);
  while( true ) {
    IVar4 = DeepImageLevel::end(this);
    if ((iterator)iVar3._M_node == IVar4._i._M_node) break;
    (**(code **)(**(long **)(iVar3._M_node + 2) + 0x20))(local_d0);
    Imf_3_2::DeepFrameBuffer::insert((string *)(local_d0 + 0x38),(DeepSlice *)(iVar3._M_node + 1));
    iVar3._M_node = (_Base_ptr)std::_Rb_tree_increment(iVar3._M_node);
  }
  Imf_3_2::DeepTiledInputFile::setFrameBuffer((DeepFrameBuffer *)in);
  local_d0._0_8_ = &this->_sampleCounts;
  local_d0._8_8_ = SampleCountChannel::beginEdit(&this->_sampleCounts);
  iVar5 = (int)in;
  iVar1 = Imf_3_2::DeepTiledInputFile::numXTiles(iVar5);
  iVar2 = Imf_3_2::DeepTiledInputFile::numYTiles(iVar5);
  Imf_3_2::DeepTiledInputFile::readPixelSampleCounts(iVar5,0,iVar1 + -1,0,iVar2 + -1,x);
  SampleCountChannel::Edit::~Edit((Edit *)local_d0);
  iVar1 = Imf_3_2::DeepTiledInputFile::numXTiles(iVar5);
  iVar2 = Imf_3_2::DeepTiledInputFile::numYTiles(iVar5);
  Imf_3_2::DeepTiledInputFile::readTiles(iVar5,0,iVar1 + -1,0,iVar2 + -1,x);
  std::
  _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>_>
  ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>_>
               *)(local_d0 + 0x38));
  return;
}

Assistant:

void
loadLevel (DeepTiledInputFile& in, DeepImage& img, int x, int y)
{
    DeepImageLevel& level = img.level (x, y);
    DeepFrameBuffer fb;

    fb.insertSampleCountSlice (level.sampleCounts ().slice ());

    for (DeepImageLevel::ConstIterator i = level.begin (); i != level.end ();
         ++i)
        fb.insert (i.name (), i.channel ().slice ());

    in.setFrameBuffer (fb);

    {
        SampleCountChannel::Edit edit (level.sampleCounts ());

        in.readPixelSampleCounts (
            0, in.numXTiles (x) - 1, 0, in.numYTiles (y) - 1, x, y);
    }

    in.readTiles (0, in.numXTiles (x) - 1, 0, in.numYTiles (y) - 1, x, y);
}